

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O2

tc_uECC_word_t
regularize_k(tc_uECC_word_t *k,tc_uECC_word_t *k0,tc_uECC_word_t *k1,tc_uECC_Curve curve)

{
  wordcount_t num_words;
  tc_uECC_word_t tVar1;
  uint uVar2;
  
  uVar2 = (uint)curve->num_n_bits;
  num_words = (wordcount_t)((int)(uVar2 + 0x1f) / 0x20);
  tVar1 = tc_uECC_vli_add(k0,k,curve->n,num_words);
  if (tVar1 == 0) {
    tVar1 = 0;
    if ((int)uVar2 < num_words * 0x20) {
      tVar1 = (tc_uECC_word_t)((k0[(int)uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0);
    }
  }
  else {
    tVar1 = 1;
  }
  tc_uECC_vli_add(k1,k0,curve->n,num_words);
  return tVar1;
}

Assistant:

tc_uECC_word_t regularize_k(const tc_uECC_word_t * const k, tc_uECC_word_t *k0,
			 tc_uECC_word_t *k1, tc_uECC_Curve curve)
{

	wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);

	bitcount_t num_n_bits = curve->num_n_bits;

	tc_uECC_word_t carry = tc_uECC_vli_add(k0, k, curve->n, num_n_words) ||
			     (num_n_bits < ((bitcount_t)num_n_words * tc_uECC_WORD_SIZE * 8) &&
			     tc_uECC_vli_testBit(k0, num_n_bits));

	tc_uECC_vli_add(k1, k0, curve->n, num_n_words);

	return carry;
}